

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adbc.cpp
# Opt level: O3

AdbcStatusCode
duckdb_adbc::DatabaseSetOption(AdbcDatabase *database,char *key,char *value,AdbcError *error)

{
  undefined8 *puVar1;
  char *pcVar2;
  AdbcStatusCode AVar3;
  int iVar4;
  duckdb_state res;
  string local_40;
  
  if (database == (AdbcDatabase *)0x0) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Missing database object","");
    SetError(error,&local_40);
  }
  else {
    if (key != (char *)0x0) {
      puVar1 = (undefined8 *)database->private_data;
      iVar4 = strcmp(key,"path");
      if (iVar4 != 0) {
        local_40._M_dataplus._M_p._0_4_ = duckdb_set_config((duckdb_config)*puVar1,key,value);
        AVar3 = CheckResult((duckdb_state *)&local_40,error,"Failed to set configuration option");
        return AVar3;
      }
      pcVar2 = (char *)puVar1[3];
      strlen(value);
      std::__cxx11::string::_M_replace((ulong)(puVar1 + 2),0,pcVar2,(ulong)value);
      return '\0';
    }
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Missing key","");
    SetError(error,&local_40);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return '\x05';
}

Assistant:

AdbcStatusCode DatabaseSetOption(struct AdbcDatabase *database, const char *key, const char *value,
                                 struct AdbcError *error) {
	if (!database) {
		SetError(error, "Missing database object");
		return ADBC_STATUS_INVALID_ARGUMENT;
	}
	if (!key) {
		SetError(error, "Missing key");
		return ADBC_STATUS_INVALID_ARGUMENT;
	}

	auto wrapper = static_cast<DuckDBAdbcDatabaseWrapper *>(database->private_data);
	if (strcmp(key, "path") == 0) {
		wrapper->path = value;
		return ADBC_STATUS_OK;
	}
	auto res = duckdb_set_config(wrapper->config, key, value);

	return CheckResult(res, error, "Failed to set configuration option");
}